

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

void __thiscall
poly::vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy>::
push_back_new_elem_w_storage_increase_copy
          (vector<Interface,_std::allocator<Interface>,_poly::virtual_cloning_policy> *this,
          my_base *v)

{
  elem_ptr_const_pointer begin;
  my_base mVar1;
  poly_copy_descr local_28;
  
  begin = (elem_ptr_const_pointer)
          (this->super_allocator_base<std::allocator<unsigned_char>_>)._storage;
  poly_uninitialized_copy
            (&local_28,v,v->_storage,begin,this->_free_elem,
             (elem_ptr_const_pointer)
             ((long)&(begin->ptr).first +
             ((long)v[1]._end_storage - (long)v->_storage & 0xffffffffffffffe0U)),
             (size_t)v[2]._storage);
  mVar1._storage =
       local_28.
       super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
       .
       super__Head_base<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
       ._M_head_impl;
  mVar1._end_storage._0_4_ =
       (int)local_28.
            super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
            .
            super__Tuple_impl<1UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
            .
            super__Head_base<1UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
            ._M_head_impl;
  mVar1._end_storage._4_4_ =
       local_28.
       super__Tuple_impl<0UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
       .
       super__Tuple_impl<1UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_void_*>
       .
       super__Head_base<1UL,_poly::vector_elem_ptr<poly::virtual_cloning_policy,_std::allocator_traits<std::allocator<Interface>_>_>_*,_false>
       ._M_head_impl._4_4_;
  v[1] = mVar1;
  return;
}

Assistant:

inline void vector<I, A, C>::push_back_new_elem_w_storage_increase_copy(
    vector& v, std::false_type /*unused*/)
{
    v.set_ptrs(poly_uninitialized_copy(v.base(), v.begin_elem(), begin_elem(), _free_elem,
        std::next(begin_elem(), v.capacity()), v.max_align()));
}